

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O0

btSoftBody *
btSoftBodyHelpers::CreateFromConvexHull
          (btSoftBodyWorldInfo *worldInfo,btVector3 *vertices,int nvertices,
          bool randomizeConstraints)

{
  uint uVar1;
  btSoftBody *pbVar2;
  uint *puVar3;
  Material *mat;
  byte in_CL;
  uint in_EDX;
  btVector3 *in_RSI;
  int idx [3];
  int i;
  btSoftBody *psb;
  HullLibrary hlib;
  HullResult hres;
  HullDesc hdsc;
  undefined3 in_stack_00000130;
  HullResult *in_stack_fffffffffffffeb8;
  HullLibrary *in_stack_fffffffffffffec0;
  Material *mat_00;
  HullResult *in_stack_fffffffffffffed0;
  btSoftBody *in_stack_fffffffffffffee0;
  uint local_ec;
  undefined1 local_e8 [104];
  btAlignedObjectArray<btVector3> local_80;
  int local_60;
  btAlignedObjectArray<unsigned_int> local_58;
  HullDesc local_38;
  byte local_15;
  uint local_14;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  HullDesc::HullDesc(&local_38,QF_DEFAULT,in_EDX,in_RSI,0x10);
  HullResult::HullResult(in_stack_fffffffffffffed0);
  HullLibrary::HullLibrary((HullLibrary *)in_stack_fffffffffffffed0);
  local_38.mMaxVertices = local_14;
  HullLibrary::CreateConvexHull
            ((HullLibrary *)CONCAT44(nvertices,_in_stack_00000130),(HullDesc *)hdsc._24_8_,
             (HullResult *)hdsc._16_8_);
  pbVar2 = (btSoftBody *)btCollisionObject::operator_new(0x294e53);
  btAlignedObjectArray<btVector3>::operator[](&local_80,0);
  btSoftBody::btSoftBody
            ((btSoftBody *)hres._0_8_,(btSoftBodyWorldInfo *)hlib.m_vertexIndexMapping._24_8_,
             hlib.m_vertexIndexMapping.m_data._4_4_,(btVector3 *)hlib.m_vertexIndexMapping._8_8_,
             (btScalar *)hlib.m_vertexIndexMapping._0_8_);
  local_e8._8_8_ = pbVar2;
  for (local_e8._4_4_ = 0; (int)local_e8._4_4_ < local_60; local_e8._4_4_ = local_e8._4_4_ + 1) {
    puVar3 = btAlignedObjectArray<unsigned_int>::operator[](&local_58,local_e8._4_4_ * 3);
    uVar1 = *puVar3;
    puVar3 = &local_ec;
    in_stack_fffffffffffffee0 =
         (btSoftBody *)
         btAlignedObjectArray<unsigned_int>::operator[](&local_58,local_e8._4_4_ * 3 + 1);
    *puVar3 = *(uint *)&(in_stack_fffffffffffffee0->super_btCollisionObject)._vptr_btCollisionObject
    ;
    mat_00 = (Material *)local_e8;
    mat = (Material *)
          btAlignedObjectArray<unsigned_int>::operator[](&local_58,local_e8._4_4_ * 3 + 2);
    *(uint *)&(mat_00->super_Element).m_tag = *(uint *)&(mat->super_Element).m_tag;
    if ((int)uVar1 < (int)local_ec) {
      btSoftBody::appendLink
                (in_stack_fffffffffffffee0,(int)((ulong)puVar3 >> 0x20),(int)puVar3,mat,
                 SUB81((ulong)mat_00 >> 0x38,0));
    }
    if ((int)local_ec < (int)local_e8._0_4_) {
      btSoftBody::appendLink
                (in_stack_fffffffffffffee0,(int)((ulong)puVar3 >> 0x20),(int)puVar3,mat,
                 SUB81((ulong)mat_00 >> 0x38,0));
    }
    if ((int)local_e8._0_4_ < (int)uVar1) {
      btSoftBody::appendLink
                (in_stack_fffffffffffffee0,(int)((ulong)puVar3 >> 0x20),(int)puVar3,mat,
                 SUB81((ulong)mat_00 >> 0x38,0));
    }
    btSoftBody::appendFace
              (in_stack_fffffffffffffee0,(int)((ulong)puVar3 >> 0x20),(int)puVar3,
               (int)((ulong)mat >> 0x20),mat_00);
  }
  HullLibrary::ReleaseResult(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if ((local_15 & 1) != 0) {
    btSoftBody::randomizeConstraints(in_stack_fffffffffffffee0);
  }
  pbVar2 = (btSoftBody *)local_e8._8_8_;
  HullLibrary::~HullLibrary((HullLibrary *)local_e8._8_8_);
  HullResult::~HullResult((HullResult *)pbVar2);
  return pbVar2;
}

Assistant:

btSoftBody*		btSoftBodyHelpers::CreateFromConvexHull(btSoftBodyWorldInfo& worldInfo,	const btVector3* vertices,
														int nvertices, bool randomizeConstraints)
{
	HullDesc		hdsc(QF_TRIANGLES,nvertices,vertices);
	HullResult		hres;
	HullLibrary		hlib;/*??*/ 
	hdsc.mMaxVertices=nvertices;
	hlib.CreateConvexHull(hdsc,hres);
	btSoftBody*		psb=new btSoftBody(&worldInfo,(int)hres.mNumOutputVertices,
		&hres.m_OutputVertices[0],0);
	for(int i=0;i<(int)hres.mNumFaces;++i)
	{
		const int idx[]={	static_cast<int>(hres.m_Indices[i*3+0]),
							static_cast<int>(hres.m_Indices[i*3+1]),
							static_cast<int>(hres.m_Indices[i*3+2])};
		if(idx[0]<idx[1]) psb->appendLink(	idx[0],idx[1]);
		if(idx[1]<idx[2]) psb->appendLink(	idx[1],idx[2]);
		if(idx[2]<idx[0]) psb->appendLink(	idx[2],idx[0]);
		psb->appendFace(idx[0],idx[1],idx[2]);
	}
	hlib.ReleaseResult(hres);
	if (randomizeConstraints)
	{
		psb->randomizeConstraints();
	}
	return(psb);
}